

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O3

Gia_Man_t * Abc_NtkTestTimDeriveGia(Abc_Ntk_t *pNtk,int fVerbose)

{
  void **ppvVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Abc_Obj_t *pNode;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar8;
  Tim_Man_t *pTVar9;
  Vec_Ptr_t *pVVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar12;
  Vec_Flt_t *vInArrs;
  Vec_Flt_t *vOutReqs;
  void *pvVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int local_64;
  int local_60;
  
  iVar5 = Abc_NtkIsTopo(pNtk);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkIsTopo(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x11a,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Abc_NtkFillTemp(pNtk);
  pVVar10 = pNtk->vObjs;
  local_60 = pNtk->vCis->nSize;
  local_64 = pNtk->vCos->nSize;
  iVar5 = pVVar10->nSize;
  if (iVar5 < 1) {
    uVar15 = 0;
  }
  else {
    uVar18 = 0;
    uVar15 = 0;
    do {
      pvVar13 = pVVar10->pArray[uVar18];
      if ((pvVar13 != (void *)0x0) && (uVar2 = *(uint *)((long)pvVar13 + 0x14), (uVar2 & 0xf) == 7))
      {
        if (((uint)(*(int *)((long)pvVar13 + 0x10) * -0x3d70a3d7) >> 3 |
            *(int *)((long)pvVar13 + 0x10) * 0x20000000) < 0x147ae15) {
          uVar3 = *(uint *)((long)pvVar13 + 0x1c);
          if (0 < (int)uVar3) {
            *(uint *)((long)pvVar13 + 0x14) = uVar2 & 0xffffffe7 | (uint)(uVar3 < 10) << 4;
            if (uVar3 < 10) {
              if ((int)uVar15 <= (int)uVar3) {
                uVar15 = uVar3;
              }
              local_60 = local_60 + 1;
              local_64 = local_64 + uVar3;
              if (fVerbose != 0) {
                printf("Selecting node %6d as white boxes with %d inputs and %d output.\n",
                       uVar18 & 0xffffffff,(ulong)uVar3,1);
              }
            }
            goto LAB_002b1fcd;
          }
        }
        *(uint *)((long)pvVar13 + 0x14) = uVar2 & 0xffffffe7;
      }
LAB_002b1fcd:
      uVar18 = uVar18 + 1;
      pVVar10 = pNtk->vObjs;
      iVar5 = pVVar10->nSize;
    } while ((long)uVar18 < (long)iVar5);
  }
  pGVar7 = Gia_ManStart(iVar5);
  p = Gia_ManStart(1000);
  iVar5 = local_60;
  if (0 < local_60) {
    do {
      pGVar8 = Gia_ManAppendObj(pGVar7);
      uVar18 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar7->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = pGVar7->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + pGVar7->nObjs <= pGVar8)) goto LAB_002b2630;
      Vec_IntPush(pGVar7->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      if ((pGVar8 < pGVar7->pObjs) || (pGVar7->pObjs + pGVar7->nObjs <= pGVar8)) goto LAB_002b2630;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (0 < (int)uVar15) {
    do {
      pGVar8 = Gia_ManAppendObj(p);
      uVar18 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) {
LAB_002b2630:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      if ((pGVar8 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar8)) goto LAB_002b2630;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  Gia_ManHashAlloc(pGVar7);
  Gia_ManHashAlloc(p);
  pTVar9 = Tim_ManStart(local_60,local_64);
  pVVar10 = pNtk->vCis;
  local_64 = 0;
  uVar18 = 0;
  if (0 < pVVar10->nSize) {
    uVar18 = 0;
    do {
      if ((long)pGVar7->vCis->nSize <= (long)uVar18) goto LAB_002b264f;
      iVar5 = pGVar7->vCis->pArray[uVar18];
      if ((iVar5 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_002b2611;
      ppvVar1 = pVVar10->pArray + uVar18;
      uVar18 = uVar18 + 1;
      *(int *)((long)*ppvVar1 + 0x40) = iVar5 * 2;
      pVVar10 = pNtk->vCis;
    } while ((long)uVar18 < (long)pVVar10->nSize);
  }
  iVar5 = (int)uVar18;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(4000);
  p_00->pArray = piVar11;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar11 = (int *)malloc(4000);
  p_01->pArray = piVar11;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    local_64 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar10->pArray[lVar14];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if ((*(uint *)&pNode->field_0x14 & 0x10) == 0) {
          iVar6 = Abc_NtkTestTimNodeStrash(pGVar7,pNode);
        }
        else {
          iVar5 = (pNode->vFanins).nSize;
          iVar17 = (int)uVar18;
          Tim_ManCreateBox(pTVar9,local_64,iVar5,iVar17,1,iVar5,0);
          iVar5 = (pNode->vFanins).nSize;
          if (0 < iVar5) {
            lVar16 = 0;
            do {
              pvVar13 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar16]];
              Vec_IntPush(p_00,*(int *)((long)pvVar13 + 0x40));
              if (p->vCis->nSize <= lVar16) goto LAB_002b264f;
              iVar6 = p->vCis->pArray[lVar16];
              if ((iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_002b2611;
              *(int *)((long)pvVar13 + 0x40) = iVar6 * 2;
              lVar16 = lVar16 + 1;
            } while (lVar16 < (pNode->vFanins).nSize);
          }
          iVar6 = Abc_NtkTestTimNodeStrash(p,pNode);
          (pNode->field_6).iTemp = iVar6;
          Vec_IntPush(p_01,iVar6);
          if ((iVar17 < 0) || (pGVar7->vCis->nSize <= iVar17)) {
LAB_002b264f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = pGVar7->vCis->pArray[uVar18 & 0xffffffff];
          if ((iVar6 < 0) || (pGVar7->nObjs <= iVar6)) {
LAB_002b2611:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          local_64 = local_64 + iVar5;
          uVar18 = (ulong)(iVar17 + 1);
          iVar6 = iVar6 * 2;
        }
        (pNode->field_6).iTemp = iVar6;
      }
      iVar5 = (int)uVar18;
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar14 < pVVar10->nSize);
  }
  Abc_NtkCleanMarkA(pNtk);
  pVVar10 = pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      Gia_ManAppendCo(pGVar7,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar10->pArray[lVar14] + 0x20)
                                                         + 8) +
                                               (long)**(int **)((long)pVVar10->pArray[lVar14] + 0x20
                                                               ) * 8) + 0x40));
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar14 < pVVar10->nSize);
  }
  iVar17 = p_00->nSize;
  piVar11 = p_00->pArray;
  if ((long)iVar17 < 1) {
    if (piVar11 != (int *)0x0) goto LAB_002b2466;
  }
  else {
    lVar14 = 0;
    do {
      Gia_ManAppendCo(pGVar7,piVar11[lVar14]);
      lVar14 = lVar14 + 1;
    } while (iVar17 != lVar14);
LAB_002b2466:
    free(piVar11);
  }
  free(p_00);
  iVar17 = p_01->nSize;
  piVar11 = p_01->pArray;
  if ((long)iVar17 < 1) {
    if (piVar11 == (int *)0x0) goto LAB_002b24ba;
  }
  else {
    lVar14 = 0;
    do {
      Gia_ManAppendCo(p,piVar11[lVar14]);
      lVar14 = lVar14 + 1;
    } while (iVar17 != lVar14);
  }
  free(piVar11);
LAB_002b24ba:
  free(p_01);
  if (iVar5 != pGVar7->vCis->nSize - pGVar7->nRegs) {
    __assert_fail("curPi == Gia_ManPiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16d,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  if (local_64 + pNtk->vPos->nSize != pGVar7->vCos->nSize - pGVar7->nRegs) {
    __assert_fail("curPo == Gia_ManPoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16e,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Gia_ManHashStop(pGVar7);
  Gia_ManSetRegNum(pGVar7,0);
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar12 = Gia_ManCleanup(pGVar7);
  Gia_ManStop(pGVar7);
  pGVar7 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (pGVar12->pManTime != (void *)0x0) {
    __assert_fail("pGia->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x17c,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  pGVar12->pManTime = pTVar9;
  vInArrs = Abc_NtkTestCreateArrivals(pNtk->vPis->nSize);
  vOutReqs = Abc_NtkTestCreateRequired(pNtk->vPos->nSize);
  Tim_ManPrint((Tim_Man_t *)pGVar12->pManTime);
  pTVar9 = (Tim_Man_t *)pGVar12->pManTime;
  pvVar13 = Abc_FrameReadLibBox();
  Tim_ManCreate(pTVar9,pvVar13,vInArrs,vOutReqs);
  Tim_ManPrint((Tim_Man_t *)pGVar12->pManTime);
  if (vInArrs->pArray != (float *)0x0) {
    free(vInArrs->pArray);
  }
  free(vInArrs);
  if (vOutReqs->pArray != (float *)0x0) {
    free(vOutReqs->pArray);
  }
  free(vOutReqs);
  Gia_AigerWrite(pGVar7,"holes00.aig",0,0);
  pGVar12->pAigExtra = pGVar7;
  return pGVar12;
}

Assistant:

Gia_Man_t * Abc_NtkTestTimDeriveGia( Abc_Ntk_t * pNtk, int fVerbose )
{
    Gia_Man_t * pTemp;
    Gia_Man_t * pGia = NULL;
    Gia_Man_t * pHoles = NULL;
    Tim_Man_t * pTim = NULL;
    Vec_Int_t * vGiaCoLits, * vGiaCoLits2;
    Vec_Flt_t * vArrTimes, * vReqTimes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Entry, curPi, curPo, BoxUniqueId;
    int nBoxFaninMax = 0;
    assert( Abc_NtkIsTopo(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // create white boxes
    curPi = Abc_NtkCiNum(pNtk);
    curPo = Abc_NtkCoNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->fMarkA = Abc_NodeIsWhiteBox( pObj );
        if ( !pObj->fMarkA )
            continue;
        nBoxFaninMax  = Abc_MaxInt( nBoxFaninMax, Abc_ObjFaninNum(pObj) );
        curPi++;
        curPo += Abc_ObjFaninNum(pObj);
        if ( fVerbose )
            printf( "Selecting node %6d as white boxes with %d inputs and %d output.\n", i, Abc_ObjFaninNum(pObj), 1 );
    }

    // construct GIA
    pGia = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pHoles = Gia_ManStart( 1000 );
    for ( i = 0; i < curPi; i++ )
        Gia_ManAppendCi(pGia);
    for ( i = 0; i < nBoxFaninMax; i++ )
        Gia_ManAppendCi(pHoles);
    Gia_ManHashAlloc( pGia );
    Gia_ManHashAlloc( pHoles );

    // construct the timing manager
    pTim = Tim_ManStart( curPi, curPo );

    // assign primary inputs
    curPi = 0;
    curPo = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    // create internal nodes in a topologic order from white boxes
    vGiaCoLits = Vec_IntAlloc( 1000 );
    vGiaCoLits2 = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !pObj->fMarkA ) // not a white box
        {
            pObj->iTemp = Abc_NtkTestTimNodeStrash( pGia, pObj );
            continue;
        }
        // create box
        BoxUniqueId = Abc_ObjFaninNum(pObj); // in this case, the node size is the ID of its delay table
        Tim_ManCreateBox( pTim, curPo, Abc_ObjFaninNum(pObj), curPi, 1, BoxUniqueId, 0 );
        curPo += Abc_ObjFaninNum(pObj);

        // handle box inputs
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            // save CO drivers for the AIG
            Vec_IntPush( vGiaCoLits, pFanin->iTemp );
            // load CI nodes for the Holes
            pFanin->iTemp = Abc_Var2Lit( Gia_ObjId(pHoles, Gia_ManCi(pHoles, k)), 0 );
        }

        // handle logic of the box
        pObj->iTemp = Abc_NtkTestTimNodeStrash( pHoles, pObj );

        // handle box outputs
        // save CO drivers for the Holes
        Vec_IntPush( vGiaCoLits2, pObj->iTemp );
//        Gia_ManAppendCo( pHoles, pObj->iTemp );
        // load CO drivers for the AIG
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    }
    Abc_NtkCleanMarkA( pNtk );
    // create COs of the AIG
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pObj)->iTemp );
    Vec_IntForEachEntry( vGiaCoLits, Entry, i )
        Gia_ManAppendCo( pGia, Entry );
    Vec_IntFree( vGiaCoLits );
    // second AIG
    Vec_IntForEachEntry( vGiaCoLits2, Entry, i )
        Gia_ManAppendCo( pHoles, Entry );
    Vec_IntFree( vGiaCoLits2 );
    // check parameters
    curPo += Abc_NtkPoNum( pNtk );
    assert( curPi == Gia_ManPiNum(pGia) );
    assert( curPo == Gia_ManPoNum(pGia) );
    // finalize GIA
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    Gia_ManHashStop( pHoles );
    Gia_ManSetRegNum( pHoles, 0 );

    // clean up GIA
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    pHoles = Gia_ManCleanup( pTemp = pHoles );
    Gia_ManStop( pTemp );

    // attach the timing manager
    assert( pGia->pManTime == NULL );
    pGia->pManTime = pTim;

    // derive hierarchy manager from box info and input/output arrival/required info
    vArrTimes = Abc_NtkTestCreateArrivals( Abc_NtkPiNum(pNtk) );
    vReqTimes = Abc_NtkTestCreateRequired( Abc_NtkPoNum(pNtk) );

    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );
    Tim_ManCreate( (Tim_Man_t *)pGia->pManTime, Abc_FrameReadLibBox(), vArrTimes, vReqTimes );
    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );

    Vec_FltFree( vArrTimes );
    Vec_FltFree( vReqTimes );

Gia_AigerWrite( pHoles, "holes00.aig", 0, 0 );

    // return 
    pGia->pAigExtra = pHoles;
    return pGia;
}